

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,CoordSys *c)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,'(');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c->c_sys);
  std::operator<<(poVar1,' ');
  std::operator<<(os,'(');
  poVar1 = std::ostream::_M_insert<double>(c->offset[0]);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>(c->offset[1]);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>(c->offset[2]);
  std::operator<<(poVar1,')');
  std::operator<<(os,'(');
  poVar1 = std::ostream::_M_insert<double>(c->dx[0]);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>(c->dx[1]);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>(c->dx[2]);
  std::operator<<(poVar1,')');
  poVar1 = std::operator<<(os,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)c->ok);
  std::operator<<(poVar1,")\n");
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&   os,
            const CoordSys& c)
{
    os << '(' << (int) c.Coord() << ' ';
    os << AMREX_D_TERM( '(' << c.Offset(0) , <<
                  ',' << c.Offset(1) , <<
                  ',' << c.Offset(2))  << ')';
    os << AMREX_D_TERM( '(' << c.CellSize(0) , <<
                  ',' << c.CellSize(1) , <<
                  ',' << c.CellSize(2))  << ')';
    os << ' ' << int(c.ok) << ")\n";
    return os;
}